

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_neon_tbl_aarch64(uint32_t ireg,uint32_t def,void *vn,uint32_t maxindex)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint32_t tmp;
  uint32_t index;
  uint64_t *table;
  undefined4 local_20;
  uint32_t shift;
  uint32_t val;
  uint32_t maxindex_local;
  void *vn_local;
  uint32_t def_local;
  uint32_t ireg_local;
  
  local_20 = 0;
  for (table._4_4_ = 0; table._4_4_ < 0x20; table._4_4_ = table._4_4_ + 8) {
    bVar3 = (byte)table._4_4_;
    uVar1 = ireg >> (bVar3 & 0x1f);
    uVar2 = uVar1 & 0xff;
    if (uVar2 < maxindex) {
      uVar1 = ((uint)(*(ulong *)((long)vn + (ulong)(uVar2 >> 3) * 8) >> (sbyte)((uVar1 & 7) << 3)) &
              0xff) << (bVar3 & 0x1f);
    }
    else {
      uVar1 = def & 0xff << (bVar3 & 0x1f);
    }
    local_20 = uVar1 | local_20;
  }
  return local_20;
}

Assistant:

uint32_t HELPER(neon_tbl)(uint32_t ireg, uint32_t def, void *vn,
                          uint32_t maxindex)
{
    uint32_t val, shift;
    uint64_t *table = vn;

    val = 0;
    for (shift = 0; shift < 32; shift += 8) {
        uint32_t index = (ireg >> shift) & 0xff;
        if (index < maxindex) {
            uint32_t tmp = (table[index >> 3] >> ((index & 7) << 3)) & 0xff;
            val |= tmp << shift;
        } else {
            val |= def & (0xff << shift);
        }
    }
    return val;
}